

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkValidate.cpp
# Opt level: O3

int __thiscall
glslang::TIntermediate::addUsedOffsets(TIntermediate *this,int binding,int offset,int numOffsets)

{
  pointer *ppTVar1;
  int iVar2;
  pointer pTVar3;
  iterator __position;
  int iVar4;
  int *piVar5;
  long lVar6;
  TOffsetRange range;
  TOffsetRange local_10;
  
  iVar4 = numOffsets + offset + -1;
  local_10.binding.last = binding;
  local_10.binding.start = binding;
  local_10.offset.last = iVar4;
  local_10.offset.start = offset;
  pTVar3 = (this->usedAtomics).
           super__Vector_base<glslang::TOffsetRange,_std::allocator<glslang::TOffsetRange>_>._M_impl
           .super__Vector_impl_data._M_start;
  __position._M_current =
       (this->usedAtomics).
       super__Vector_base<glslang::TOffsetRange,_std::allocator<glslang::TOffsetRange>_>._M_impl.
       super__Vector_impl_data._M_finish;
  lVar6 = (long)__position._M_current - (long)pTVar3;
  if (lVar6 != 0) {
    lVar6 = lVar6 >> 4;
    lVar6 = lVar6 + (ulong)(lVar6 == 0);
    piVar5 = &(pTVar3->offset).last;
    do {
      if ((((piVar5[-3] <= binding) && (binding <= piVar5[-2])) &&
          (iVar2 = ((TRange *)(piVar5 + -1))->start, iVar2 <= iVar4)) && (offset <= *piVar5)) {
        if (iVar2 <= offset) {
          return offset;
        }
        return iVar2;
      }
      piVar5 = piVar5 + 4;
      lVar6 = lVar6 + -1;
    } while (lVar6 != 0);
  }
  if (__position._M_current ==
      (this->usedAtomics).
      super__Vector_base<glslang::TOffsetRange,_std::allocator<glslang::TOffsetRange>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<glslang::TOffsetRange,std::allocator<glslang::TOffsetRange>>::
    _M_realloc_insert<glslang::TOffsetRange_const&>
              ((vector<glslang::TOffsetRange,std::allocator<glslang::TOffsetRange>> *)
               &this->usedAtomics,__position,&local_10);
  }
  else {
    (__position._M_current)->binding = local_10.binding;
    (__position._M_current)->offset = local_10.offset;
    ppTVar1 = &(this->usedAtomics).
               super__Vector_base<glslang::TOffsetRange,_std::allocator<glslang::TOffsetRange>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    *ppTVar1 = *ppTVar1 + 1;
  }
  return -1;
}

Assistant:

int TIntermediate::addUsedOffsets(int binding, int offset, int numOffsets)
{
    TRange bindingRange(binding, binding);
    TRange offsetRange(offset, offset + numOffsets - 1);
    TOffsetRange range(bindingRange, offsetRange);

    // check for collisions, except for vertex inputs on desktop
    for (size_t r = 0; r < usedAtomics.size(); ++r) {
        if (range.overlap(usedAtomics[r])) {
            // there is a collision; pick one
            return std::max(offset, usedAtomics[r].offset.start);
        }
    }

    usedAtomics.push_back(range);

    return -1; // no collision
}